

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O2

void __thiscall cbtCollisionWorld::debugDrawWorld(cbtCollisionWorld *this)

{
  undefined8 uVar1;
  cbtCollisionObject *pcVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar5;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  int i;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  cbtVector3 colorvec;
  DefaultColors defaultColors;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined8 local_100;
  float local_f8;
  float local_f4;
  uint local_ec;
  undefined8 local_e8;
  float local_e0;
  float local_dc;
  ulong local_d8;
  float local_d0;
  float local_cc;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  undefined8 local_50;
  undefined8 uStack_48;
  undefined1 local_40 [16];
  
  iVar3 = (*this->_vptr_cbtCollisionWorld[5])();
  if (CONCAT44(extraout_var,iVar3) != 0) {
    iVar3 = (*this->_vptr_cbtCollisionWorld[5])(this);
    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 200))
              ((long *)CONCAT44(extraout_var_00,iVar3));
    iVar3 = (*this->_vptr_cbtCollisionWorld[5])(this);
    (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x10))(local_a0);
    iVar3 = (*this->_vptr_cbtCollisionWorld[5])(this);
    uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x70))
                      ((long *)CONCAT44(extraout_var_02,iVar3));
    if (((uVar5 & 8) != 0) && (this->m_dispatcher1 != (cbtDispatcher *)0x0)) {
      local_ec = (*this->m_dispatcher1->_vptr_cbtDispatcher[9])();
      local_ec = ~((int)local_ec >> 0x1f) & local_ec;
      uVar5 = 0;
      while ((uint)uVar5 != local_ec) {
        local_c8._0_8_ = uVar5;
        iVar3 = (*this->m_dispatcher1->_vptr_cbtDispatcher[10])();
        lVar6 = CONCAT44(extraout_var_03,iVar3);
        uVar4 = *(uint *)(lVar6 + 0x398);
        for (lVar7 = 0; (ulong)(~((int)uVar4 >> 0x1f) & uVar4) * 0xe0 - lVar7 != 0;
            lVar7 = lVar7 + 0xe0) {
          iVar3 = (*this->_vptr_cbtCollisionWorld[5])(this);
          (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar3) + 0x50))
                    (*(undefined4 *)(lVar6 + 0x70 + lVar7),(long *)CONCAT44(extraout_var_04,iVar3),
                     lVar6 + 0x40 + lVar7,lVar6 + 0x60 + lVar7,*(undefined4 *)(lVar6 + 0xc4 + lVar7)
                     ,local_40);
        }
        uVar5 = (ulong)(local_c8._0_4_ + 1);
      }
    }
    iVar3 = (*this->_vptr_cbtCollisionWorld[5])(this);
    uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar3) + 0x70))
                      ((long *)CONCAT44(extraout_var_05,iVar3));
    if ((uVar5 & 3) != 0) {
      for (lVar6 = 0; lVar6 < (this->m_collisionObjects).m_size; lVar6 = lVar6 + 1) {
        pcVar2 = (this->m_collisionObjects).m_data[lVar6];
        if ((pcVar2->m_collisionFlags & 0x20) == 0) {
          iVar3 = (*this->_vptr_cbtCollisionWorld[5])(this);
          if (CONCAT44(extraout_var_06,iVar3) != 0) {
            iVar3 = (*this->_vptr_cbtCollisionWorld[5])(this);
            uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar3) + 0x70))
                              ((long *)CONCAT44(extraout_var_07,iVar3));
            if ((uVar5 & 1) != 0) {
              switch(pcVar2->m_activationState1) {
              case 1:
                _local_118 = local_a0;
                break;
              case 2:
                _local_118 = local_90;
                break;
              case 3:
                _local_118 = local_80;
                break;
              case 4:
                _local_118 = local_70;
                break;
              case 5:
                _local_118 = local_60;
                break;
              default:
                _local_118 = _DAT_00f5ca00;
              }
              if ((pcVar2->m_collisionFlags & 0x100) != 0) {
                _local_118 = *(undefined1 (*) [16])(pcVar2->m_customDebugColorRGB).m_floats;
              }
              (*this->_vptr_cbtCollisionWorld[7])
                        (this,&pcVar2->m_worldTransform,pcVar2->m_collisionShape,local_118);
            }
          }
          if ((this->m_debugDrawer != (cbtIDebugDraw *)0x0) &&
             (uVar4 = (*this->m_debugDrawer->_vptr_cbtIDebugDraw[0xe])(), (uVar4 & 2) != 0)) {
            local_b8 = local_50;
            uStack_b0 = uStack_48;
            (*pcVar2->m_collisionShape->_vptr_cbtCollisionShape[2])
                      (pcVar2->m_collisionShape,&pcVar2->m_worldTransform,local_118,&local_100);
            auVar8._8_8_ = 0;
            auVar8._0_8_ = local_118;
            auVar11._4_4_ = gContactBreakingThreshold;
            auVar11._0_4_ = gContactBreakingThreshold;
            auVar11._8_4_ = gContactBreakingThreshold;
            auVar11._12_4_ = gContactBreakingThreshold;
            auVar8 = vsubps_avx(auVar8,auVar11);
            uVar1 = vmovlps_avx(auVar8);
            fStack_110 = fStack_110 - gContactBreakingThreshold;
            local_118 = (undefined1  [8])uVar1;
            auVar9._0_4_ = gContactBreakingThreshold + (float)local_100;
            auVar9._4_4_ = gContactBreakingThreshold + (float)((ulong)local_100 >> 0x20);
            auVar9._8_4_ = gContactBreakingThreshold + 0.0;
            auVar9._12_4_ = gContactBreakingThreshold + 0.0;
            local_100 = vmovlps_avx(auVar9);
            local_f8 = gContactBreakingThreshold + local_f8;
            if (((this->m_dispatchInfo).m_useContinuous == true) &&
               ((pcVar2->m_internalType == 2 && ((pcVar2->m_collisionFlags & 3) == 0)))) {
              local_c8 = auVar11;
              (*pcVar2->m_collisionShape->_vptr_cbtCollisionShape[2])
                        (pcVar2->m_collisionShape,&pcVar2->m_interpolationWorldTransform,&local_d8,
                         &local_e8);
              auVar10._8_8_ = 0;
              auVar10._0_8_ = local_d8;
              auVar8 = vsubps_avx(auVar10,local_c8);
              local_d8 = vmovlps_avx(auVar8);
              fVar13 = local_c8._0_4_;
              local_d0 = local_d0 - fVar13;
              auVar12._0_4_ = fVar13 + (float)local_e8;
              auVar12._4_4_ = local_c8._4_4_ + (float)((ulong)local_e8 >> 0x20);
              auVar12._8_4_ = local_c8._8_4_ + 0.0;
              auVar12._12_4_ = local_c8._12_4_ + 0.0;
              local_e8 = vmovlps_avx(auVar12);
              local_e0 = fVar13 + local_e0;
              if (auVar8._0_4_ < (float)local_118._0_4_) {
                local_118._0_4_ = auVar8._0_4_;
              }
              auVar8 = vmovshdup_avx(auVar8);
              if (auVar8._0_4_ < (float)local_118._4_4_) {
                local_118._4_4_ = auVar8._0_4_;
              }
              if (local_d0 < fStack_110) {
                fStack_110 = local_d0;
              }
              if (local_cc < fStack_10c) {
                fStack_10c = local_cc;
              }
              if ((float)local_100 < auVar12._0_4_) {
                local_100 = CONCAT44(local_100._4_4_,auVar12._0_4_);
              }
              auVar8 = vmovshdup_avx(auVar12);
              if (local_100._4_4_ < auVar8._0_4_) {
                local_100 = CONCAT44(auVar8._0_4_,(float)local_100);
              }
              if (local_f8 < local_e0) {
                local_f8 = local_e0;
              }
              if (local_f4 < local_dc) {
                local_f4 = local_dc;
              }
            }
            (*this->m_debugDrawer->_vptr_cbtIDebugDraw[0xf])
                      (this->m_debugDrawer,local_118,&local_100,&local_b8);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void cbtCollisionWorld::debugDrawWorld()
{
	if (getDebugDrawer())
	{
		getDebugDrawer()->clearLines();

		cbtIDebugDraw::DefaultColors defaultColors = getDebugDrawer()->getDefaultColors();

		if (getDebugDrawer()->getDebugMode() & cbtIDebugDraw::DBG_DrawContactPoints)
		{
			if (getDispatcher())
			{
				int numManifolds = getDispatcher()->getNumManifolds();

				for (int i = 0; i < numManifolds; i++)
				{
					cbtPersistentManifold* contactManifold = getDispatcher()->getManifoldByIndexInternal(i);
					//cbtCollisionObject* obA = static_cast<cbtCollisionObject*>(contactManifold->getBody0());
					//cbtCollisionObject* obB = static_cast<cbtCollisionObject*>(contactManifold->getBody1());

					int numContacts = contactManifold->getNumContacts();
					for (int j = 0; j < numContacts; j++)
					{
						cbtManifoldPoint& cp = contactManifold->getContactPoint(j);
						getDebugDrawer()->drawContactPoint(cp.m_positionWorldOnB, cp.m_normalWorldOnB, cp.getDistance(), cp.getLifeTime(), defaultColors.m_contactPoint);
					}
				}
			}
		}

		if ((getDebugDrawer()->getDebugMode() & (cbtIDebugDraw::DBG_DrawWireframe | cbtIDebugDraw::DBG_DrawAabb)))
		{
			int i;

			for (i = 0; i < m_collisionObjects.size(); i++)
			{
				cbtCollisionObject* colObj = m_collisionObjects[i];
				if ((colObj->getCollisionFlags() & cbtCollisionObject::CF_DISABLE_VISUALIZE_OBJECT) == 0)
				{
					if (getDebugDrawer() && (getDebugDrawer()->getDebugMode() & cbtIDebugDraw::DBG_DrawWireframe))
					{
						cbtVector3 color(cbtScalar(0.4), cbtScalar(0.4), cbtScalar(0.4));

						switch (colObj->getActivationState())
						{
							case ACTIVE_TAG:
								color = defaultColors.m_activeObject;
								break;
							case ISLAND_SLEEPING:
								color = defaultColors.m_deactivatedObject;
								break;
							case WANTS_DEACTIVATION:
								color = defaultColors.m_wantsDeactivationObject;
								break;
							case DISABLE_DEACTIVATION:
								color = defaultColors.m_disabledDeactivationObject;
								break;
							case DISABLE_SIMULATION:
								color = defaultColors.m_disabledSimulationObject;
								break;
							default:
							{
								color = cbtVector3(cbtScalar(.3), cbtScalar(0.3), cbtScalar(0.3));
							}
						};

						colObj->getCustomDebugColor(color);

						debugDrawObject(colObj->getWorldTransform(), colObj->getCollisionShape(), color);
					}
					if (m_debugDrawer && (m_debugDrawer->getDebugMode() & cbtIDebugDraw::DBG_DrawAabb))
					{
						cbtVector3 minAabb, maxAabb;
						cbtVector3 colorvec = defaultColors.m_aabb;
						colObj->getCollisionShape()->getAabb(colObj->getWorldTransform(), minAabb, maxAabb);
						cbtVector3 contactThreshold(gContactBreakingThreshold, gContactBreakingThreshold, gContactBreakingThreshold);
						minAabb -= contactThreshold;
						maxAabb += contactThreshold;

						cbtVector3 minAabb2, maxAabb2;

						if (getDispatchInfo().m_useContinuous && colObj->getInternalType() == cbtCollisionObject::CO_RIGID_BODY && !colObj->isStaticOrKinematicObject())
						{
							colObj->getCollisionShape()->getAabb(colObj->getInterpolationWorldTransform(), minAabb2, maxAabb2);
							minAabb2 -= contactThreshold;
							maxAabb2 += contactThreshold;
							minAabb.setMin(minAabb2);
							maxAabb.setMax(maxAabb2);
						}

						m_debugDrawer->drawAabb(minAabb, maxAabb, colorvec);
					}
				}
			}
		}
	}
}